

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reversed_tests.cpp
# Opt level: O0

void __thiscall
omp_reversed_move_case_Test::omp_reversed_move_case_Test(omp_reversed_move_case_Test *this)

{
  omp_reversed_move_case_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__omp_reversed_move_case_Test_0023f2a0;
  return;
}

Assistant:

TEST(omp_reversed, move_case) {
  std::vector values = {1, 4, 3, 2, 5};

  auto reversed_values = omp::reversed(std::move(values));

  std::vector expecting = {5, 2, 3, 4, 1};

  ASSERT_TRUE(std::equal(std::cbegin(reversed_values),
                         std::cend(reversed_values), std::cbegin(expecting),
                         std::cend(expecting)));
}